

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AST.cc
# Opt level: O0

void __thiscall
flow::lang::HandlerSym::implement
          (HandlerSym *this,
          unique_ptr<flow::lang::SymbolTable,_std::default_delete<flow::lang::SymbolTable>_> *table,
          unique_ptr<flow::lang::Stmt,_std::default_delete<flow::lang::Stmt>_> *body)

{
  unique_ptr<flow::lang::Stmt,_std::default_delete<flow::lang::Stmt>_> *body_local;
  unique_ptr<flow::lang::SymbolTable,_std::default_delete<flow::lang::SymbolTable>_> *table_local;
  HandlerSym *this_local;
  
  std::unique_ptr<flow::lang::SymbolTable,_std::default_delete<flow::lang::SymbolTable>_>::operator=
            (&this->scope_,table);
  std::unique_ptr<flow::lang::Stmt,_std::default_delete<flow::lang::Stmt>_>::operator=
            (&this->body_,body);
  return;
}

Assistant:

void HandlerSym::implement(std::unique_ptr<SymbolTable>&& table,
                           std::unique_ptr<Stmt>&& body) {
  scope_ = std::move(table);
  body_ = std::move(body);
}